

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall
wasm::Instrumenter::Instrumenter(Instrumenter *this,InstrumenterConfig *config,uint64_t moduleHash)

{
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Instrumenter_00132cd0;
  this->wasm = (Module *)0x0;
  this->config = config;
  this->moduleHash = moduleHash;
  (this->counterGlobal).super_IString.str._M_len = 0;
  (this->counterGlobal).super_IString.str._M_str = (char *)0x0;
  (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->secondaryMemory).super_IString.str._M_len = 0;
  (this->secondaryMemory).super_IString.str._M_str = (char *)0x0;
  return;
}

Assistant:

Instrumenter::Instrumenter(const InstrumenterConfig& config,
                           uint64_t moduleHash)
  : config(config), moduleHash(moduleHash) {}